

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

float forcefloat(tagval *v)

{
  float fVar1;
  
  fVar1 = 0.0;
  switch(v->type) {
  case 1:
    fVar1 = (float)(v->super_identval).field_0.i;
    break;
  case 2:
    return (float)(v->super_identval).field_0.i;
  case 3:
  case 6:
    fVar1 = parsefloat((v->super_identval).field_0.s);
  }
  freearg(v);
  v->type = 2;
  (v->super_identval).field_0.i = (int)fVar1;
  return fVar1;
}

Assistant:

static inline float forcefloat(tagval &v)
{
    float f = 0.0f;
    switch(v.type)
    {
        case VAL_INT: f = v.i; break;
        case VAL_STR: f = parsefloat(v.s); break;
        case VAL_MACRO: f = parsefloat(v.s); break;
        case VAL_FLOAT: return v.f;
    }
    freearg(v);
    v.setfloat(f);
    return f;
}